

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void mkgrave(level *lev,mkroom *croom)

{
  undefined8 uVar1;
  boolean bVar2;
  undefined4 in_EAX;
  uint uVar3;
  obj *otmp;
  char *str;
  int iVar4;
  int iVar5;
  int y;
  coord m;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  uVar3 = mt_random();
  if (croom->rtype == '\0') {
    uStack_38 = CONCAT44(uVar3 % 10,(undefined4)uStack_38);
    iVar4 = 200;
    do {
      bVar2 = somexy(lev,croom,(coord *)((long)&uStack_38 + 2));
      if (bVar2 == '\0') {
        return;
      }
      bVar2 = occupied(lev,uStack_38._2_1_,uStack_38._3_1_);
      if (bVar2 == '\0') {
        iVar5 = (int)uStack_38._2_1_;
        y = (int)uStack_38._3_1_;
        bVar2 = bydoor(lev,uStack_38._2_1_,uStack_38._3_1_);
        if (bVar2 == '\0') {
          str = (char *)0x0;
          if (uStack_38._4_4_ == 0) {
            str = "Saved by the bell!";
          }
          make_grave(lev,iVar5,y,str);
          uVar3 = mt_random();
          if (uVar3 * -0x55555555 < 0x55555556) {
            mkgold(0,lev,(int)uStack_38._2_1_,(int)uStack_38._3_1_);
          }
          uVar3 = mt_random();
          uVar3 = uVar3 % 5;
          uVar1 = uStack_38;
          while( true ) {
            uStack_38 = uVar1;
            if (uVar3 == 0) {
              uStack_38._4_4_ = (int)((ulong)uVar1 >> 0x20);
              if (uStack_38._4_4_ != 0) {
                return;
              }
              uStack_38._2_1_ = (xchar)((ulong)uVar1 >> 0x10);
              iVar5 = (int)uStack_38._2_1_;
              uStack_38._3_1_ = (xchar)((ulong)uVar1 >> 0x18);
              iVar4 = (int)uStack_38._3_1_;
              mksobj_at(0x104,lev,iVar5,iVar4,'\x01','\0');
              return;
            }
            otmp = mkobj(lev,'\0','\x01');
            if (otmp == (obj *)0x0) break;
            curse(otmp);
            otmp->ox = uStack_38._2_1_;
            otmp->oy = uStack_38._3_1_;
            add_to_buried(otmp);
            uVar3 = uVar3 - 1;
            uVar1 = uStack_38;
          }
          return;
        }
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

static void mkgrave(struct level *lev, struct mkroom *croom)
{
	coord m;
	int tryct = 0;
	struct obj *otmp;
	boolean dobell = !rn2(10);


	if (croom->rtype != OROOM) return;

	do {
	    if (++tryct > 200) return;
	    if (!somexy(lev, croom, &m))
		return;
	} while (occupied(lev, m.x, m.y) || bydoor(lev, m.x, m.y));

	/* Put a grave at m.x, m.y */
	make_grave(lev, m.x, m.y, dobell ? "Saved by the bell!" : NULL);

	/* Possibly fill it with objects */
	if (!rn2(3)) mkgold(0L, lev, m.x, m.y);
	for (tryct = rn2(5); tryct; tryct--) {
	    otmp = mkobj(lev, RANDOM_CLASS, TRUE);
	    if (!otmp) return;
	    curse(otmp);
	    otmp->ox = m.x;
	    otmp->oy = m.y;
	    add_to_buried(otmp);
	}

	/* Leave a bell, in case we accidentally buried someone alive */
	if (dobell) mksobj_at(BELL, lev, m.x, m.y, TRUE, FALSE);
	return;
}